

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

int readdecesc(LexState *ls)

{
  size_t sVar1;
  byte *pbVar2;
  bool bVar3;
  uint local_20;
  int local_18;
  int local_14;
  int r;
  int i;
  LexState *ls_local;
  
  local_18 = 0;
  local_14 = 0;
  while( true ) {
    bVar3 = false;
    if (local_14 < 3) {
      bVar3 = (""[ls->current + 1] & 2) != 0;
    }
    if (!bVar3) break;
    local_18 = local_18 * 10 + ls->current + -0x30;
    save(ls,ls->current);
    sVar1 = ls->z->n;
    ls->z->n = sVar1 - 1;
    if (sVar1 == 0) {
      local_20 = luaZ_fill(ls->z);
    }
    else {
      pbVar2 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar2 + 1);
      local_20 = (uint)*pbVar2;
    }
    ls->current = local_20;
    local_14 = local_14 + 1;
  }
  esccheck(ls,(uint)(local_18 < 0x100),"decimal escape too large");
  ls->buff->n = ls->buff->n - (long)local_14;
  return local_18;
}

Assistant:

static int readdecesc (LexState *ls) {
  int i;
  int r = 0;  /* result accumulator */
  for (i = 0; i < 3 && lisdigit(ls->current); i++) {  /* read up to 3 digits */
    r = 10*r + ls->current - '0';
    save_and_next(ls);
  }
  esccheck(ls, r <= UCHAR_MAX, "decimal escape too large");
  luaZ_buffremove(ls->buff, i);  /* remove read digits from buffer */
  return r;
}